

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Resource.cpp
# Opt level: O2

void Corrade::Utility::Resource::overrideGroup(StringView group,StringView configurationFile)

{
  _Rb_tree<Corrade::Containers::BasicStringView<char_const>,std::pair<Corrade::Containers::BasicStringView<char_const>const,Corrade::Containers::String>,std::_Select1st<std::pair<Corrade::Containers::BasicStringView<char_const>const,Corrade::Containers::String>>,std::less<Corrade::Containers::BasicStringView<char_const>>,std::allocator<std::pair<Corrade::Containers::BasicStringView<char_const>const,Corrade::Containers::String>>>
  *this;
  char *pcVar1;
  size_t sVar2;
  int iVar3;
  ResourceGroup *pRVar4;
  ostream *output;
  Debug *pDVar5;
  char *pcVar6;
  char *pcVar7;
  String *this_00;
  String *pSVar8;
  String *extraout_RDX;
  String *extraout_RDX_00;
  StringView name;
  StringView value;
  StringView view;
  pair<std::_Rb_tree_iterator<std::pair<const_Corrade::Containers::BasicStringView<const_char>,_Corrade::Containers::String>_>,_bool>
  pVar9;
  BasicStringView<const_char> local_70;
  Error local_60;
  String local_38;
  
  pcVar6 = (char *)configurationFile._sizePlusFlags;
  this_00 = (String *)configurationFile._data;
  local_70._sizePlusFlags = group._sizePlusFlags;
  local_70._data = group._data;
  pcVar7 = pcVar6;
  pSVar8 = this_00;
  if ((_Rb_tree<Corrade::Containers::BasicStringView<char_const>,std::pair<Corrade::Containers::BasicStringView<char_const>const,Corrade::Containers::String>,std::_Select1st<std::pair<Corrade::Containers::BasicStringView<char_const>const,Corrade::Containers::String>>,std::less<Corrade::Containers::BasicStringView<char_const>>,std::allocator<std::pair<Corrade::Containers::BasicStringView<char_const>const,Corrade::Containers::String>>>
       *)DAT_0017aec8 ==
      (_Rb_tree<Corrade::Containers::BasicStringView<char_const>,std::pair<Corrade::Containers::BasicStringView<char_const>const,Corrade::Containers::String>,std::_Select1st<std::pair<Corrade::Containers::BasicStringView<char_const>const,Corrade::Containers::String>>,std::less<Corrade::Containers::BasicStringView<char_const>>,std::allocator<std::pair<Corrade::Containers::BasicStringView<char_const>const,Corrade::Containers::String>>>
       *)0x0) {
    if (overrideGroup(Corrade::Containers::BasicStringView<char_const>,Corrade::Containers::BasicStringView<char_const>)
        ::overrideGroups == '\0') {
      iVar3 = __cxa_guard_acquire(&overrideGroup(Corrade::Containers::BasicStringView<char_const>,Corrade::Containers::BasicStringView<char_const>)
                                   ::overrideGroups);
      pSVar8 = extraout_RDX;
      if (iVar3 != 0) {
        overrideGroup::overrideGroups._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red
        ;
        overrideGroup::overrideGroups._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)0x0;
        overrideGroup::overrideGroups._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &overrideGroup::overrideGroups._M_t._M_impl.super__Rb_tree_header._M_header;
        overrideGroup::overrideGroups._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             &overrideGroup::overrideGroups._M_t._M_impl.super__Rb_tree_header._M_header;
        overrideGroup::overrideGroups._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        __cxa_atexit(std::
                     map<Corrade::Containers::BasicStringView<const_char>,_Corrade::Containers::String,_std::less<Corrade::Containers::BasicStringView<const_char>_>,_std::allocator<std::pair<const_Corrade::Containers::BasicStringView<const_char>,_Corrade::Containers::String>_>_>
                     ::~map,&overrideGroup::overrideGroups,&__dso_handle);
        __cxa_guard_release(&overrideGroup(Corrade::Containers::BasicStringView<char_const>,Corrade::Containers::BasicStringView<char_const>)
                             ::overrideGroups);
        pSVar8 = extraout_RDX_00;
      }
    }
    DAT_0017aec8 = &overrideGroup::overrideGroups;
  }
  sVar2 = local_70._sizePlusFlags;
  pcVar1 = local_70._data;
  name._sizePlusFlags = (size_t)pSVar8;
  name._data = (char *)local_70._sizePlusFlags;
  pRVar4 = anon_unknown_3::findGroup((anon_unknown_3 *)local_70._data,name);
  if (pRVar4 != (ResourceGroup *)0x0) {
    view._sizePlusFlags = (size_t)pcVar7;
    view._data = pcVar6;
    Containers::String::nullTerminatedGlobalView((String *)&local_60,this_00,view);
    this = (_Rb_tree<Corrade::Containers::BasicStringView<char_const>,std::pair<Corrade::Containers::BasicStringView<char_const>const,Corrade::Containers::String>,std::_Select1st<std::pair<Corrade::Containers::BasicStringView<char_const>const,Corrade::Containers::String>>,std::less<Corrade::Containers::BasicStringView<char_const>>,std::allocator<std::pair<Corrade::Containers::BasicStringView<char_const>const,Corrade::Containers::String>>>
            *)DAT_0017aec8;
    Containers::String::String(&local_38);
    pVar9 = std::
            _Rb_tree<Corrade::Containers::BasicStringView<char_const>,std::pair<Corrade::Containers::BasicStringView<char_const>const,Corrade::Containers::String>,std::_Select1st<std::pair<Corrade::Containers::BasicStringView<char_const>const,Corrade::Containers::String>>,std::less<Corrade::Containers::BasicStringView<char_const>>,std::allocator<std::pair<Corrade::Containers::BasicStringView<char_const>const,Corrade::Containers::String>>>
            ::
            _M_emplace_unique<Corrade::Containers::BasicStringView<char_const>const&,Corrade::Containers::String>
                      (this,&local_70,&local_38);
    Containers::String::operator=
              ((String *)&pVar9.first._M_node._M_node[1]._M_left,(String *)&local_60);
    Containers::String::~String(&local_38);
    Containers::String::~String((String *)&local_60);
    return;
  }
  output = Error::defaultOutput();
  Error::Error(&local_60,output,(Flags)0x0);
  pDVar5 = Debug::operator<<(&local_60.super_Debug,"Utility::Resource::overrideGroup(): group \'");
  (pDVar5->_immediateFlags)._value = (pDVar5->_immediateFlags)._value | 4;
  value._sizePlusFlags = sVar2;
  value._data = pcVar1;
  pDVar5 = Debug::operator<<(pDVar5,value);
  (pDVar5->_immediateFlags)._value = (pDVar5->_immediateFlags)._value | 4;
  Debug::operator<<(pDVar5,"\' was not found");
  Error::~Error(&local_60);
  abort();
}

Assistant:

void Resource::overrideGroup(const Containers::StringView group, const Containers::StringView configurationFile) {
    if(!resourceGlobals.overrideGroups) {
        static std::map<Containers::StringView, Containers::String> overrideGroups;
        resourceGlobals.overrideGroups = &overrideGroups;
    }

    CORRADE_ASSERT(findGroup(group),
        "Utility::Resource::overrideGroup(): group '" << Debug::nospace << group << Debug::nospace << "' was not found", );
    /* This group can be already overridden from before, so insert if not there
       yet and then update the filename */
    resourceGlobals.overrideGroups->emplace(group, Containers::String{}).first->second = Containers::String::nullTerminatedGlobalView(configurationFile);
}